

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationEnd
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  TestEventListener *pTVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((this->forwarding_enabled_ == true) &&
     (uVar2 = (uint)((ulong)((long)(this->listeners_).
                                   super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->listeners_).
                                  super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3), 0 < (int)uVar2))
  {
    uVar3 = (ulong)(uVar2 & 0x7fffffff) + 1;
    do {
      pTVar1 = (this->listeners_).
               super__Vector_base<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3 - 2];
      (*pTVar1->_vptr_TestEventListener[0xd])(pTVar1,unit_test,(ulong)(uint)iteration);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationEnd(const UnitTest& unit_test,
                                           int iteration) {
  if (forwarding_enabled_) {
    for (int i = static_cast<int>(listeners_.size()) - 1; i >= 0; i--) {
      listeners_[i]->OnTestIterationEnd(unit_test, iteration);
    }
  }
}